

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O2

int CVBBDPrecReInitB(void *cvode_mem,int which,sunindextype mudqB,sunindextype mldqB,
                    sunrealtype dqrelyB)

{
  int iVar1;
  int *piVar2;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    cvode_mem = (CVodeMem)0x0;
    iVar1 = 0x351;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjInit.";
    error_code = -0x65;
    iVar1 = 0x35a;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      for (piVar2 = (int *)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
          (piVar2 = *(int **)piVar2, piVar2 != (int *)0x0 && (*piVar2 != which));
          piVar2 = piVar2 + 0x1e) {
      }
      iVar1 = CVBBDPrecReInit(*(void **)(piVar2 + 4),mudqB,mldqB,dqrelyB);
      return iVar1;
    }
    msgfmt = "Illegal value for the which parameter.";
    error_code = -3;
    iVar1 = 0x363;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVBBDPrecReInitB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVBBDPrecReInitB(void* cvode_mem, int which, sunindextype mudqB,
                     sunindextype mldqB, sunrealtype dqrelyB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSGBBD_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    /* advance */
    cvB_mem = cvB_mem->cv_next;
  }
  /* cv_mem corresponding to 'which' backward problem. */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  /* ReInitialize the BBD preconditioner for this backward problem. */
  flag = CVBBDPrecReInit(cvodeB_mem, mudqB, mldqB, dqrelyB);
  return (flag);
}